

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>::iterator,_phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>::iterator>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::equal_range<phmap::priv::hash_internal::Enum>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>::iterator,_phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>::iterator>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
          *this,key_arg<phmap::priv::hash_internal::Enum> *key)

{
  iterator __x;
  iterator iVar1;
  
  __x = find<phmap::priv::hash_internal::Enum>(this,key);
  iVar1 = __x;
  if (__x.ctrl_ != this->ctrl_ + this->capacity_) {
    iVar1 = std::
            next<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>::iterator>
                      (__x,1);
  }
  __return_storage_ptr__->first = __x;
  __return_storage_ptr__->second = iVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key) {
        auto it = find(key);
        if (it != end()) return {it, std::next(it)};
        return {it, it};
    }